

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

void writeModelObjective(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                        vector<double,_std::allocator<double>_> *primal_solution)

{
  HighsCDouble objective_value;
  HighsCDouble local_48;
  HighsCDouble local_38;
  
  local_38 = HighsLp::objectiveCDoubleValue(&model->lp_,primal_solution);
  local_48 = HighsHessian::objectiveCDoubleValue(&model->hessian_,primal_solution);
  HighsCDouble::operator+=(&local_38,&local_48);
  writeObjectiveValue(file,log_options,local_38.hi + local_38.lo);
  return;
}

Assistant:

void writeModelObjective(FILE* file, const HighsLogOptions& log_options,
                         const HighsModel& model,
                         const std::vector<double>& primal_solution) {
  HighsCDouble objective_value =
      model.lp_.objectiveCDoubleValue(primal_solution);
  objective_value += model.hessian_.objectiveCDoubleValue(primal_solution);
  writeObjectiveValue(file, log_options, (double)objective_value);
}